

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

bool __thiscall kj::PathPtr::startsWith(PathPtr *this,PathPtr prefix)

{
  String *pSVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  String *pSVar11;
  char *pcVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  
  uVar9 = prefix.parts.size_;
  pSVar11 = prefix.parts.ptr;
  if ((this->parts).size_ < uVar9) {
    return false;
  }
  bVar15 = uVar9 == 0;
  if (!bVar15) {
    pSVar1 = (this->parts).ptr;
    sVar2 = (pSVar1->content).size_;
    sVar10 = sVar2 + (sVar2 == 0);
    sVar3 = (pSVar11->content).size_;
    if (sVar10 == sVar3 + (sVar3 == 0)) {
      pcVar13 = "";
      pcVar12 = "";
      if (sVar3 != 0) {
        pcVar12 = (pSVar11->content).ptr;
      }
      if (sVar2 != 0) {
        pcVar13 = (pSVar1->content).ptr;
      }
      iVar7 = bcmp(pcVar13,pcVar12,sVar10);
      if (iVar7 == 0) {
        lVar14 = 0x20;
        uVar6 = 1;
        do {
          uVar8 = uVar6;
          if (uVar9 == uVar8) break;
          lVar4 = *(long *)((long)&(pSVar1->content).ptr + lVar14);
          sVar10 = lVar4 + (ulong)(lVar4 == 0);
          lVar5 = *(long *)((long)&(pSVar11->content).ptr + lVar14);
          if (sVar10 != lVar5 + (ulong)(lVar5 == 0)) break;
          pcVar12 = "";
          if (lVar5 != 0) {
            pcVar12 = *(char **)((long)pSVar11 + lVar14 + -8);
          }
          pcVar13 = "";
          if (lVar4 != 0) {
            pcVar13 = *(char **)((long)pSVar1 + lVar14 + -8);
          }
          iVar7 = bcmp(pcVar13,pcVar12,sVar10);
          lVar14 = lVar14 + 0x18;
          uVar6 = uVar8 + 1;
        } while (iVar7 == 0);
        return uVar9 <= uVar8;
      }
    }
    bVar15 = false;
  }
  return bVar15;
}

Assistant:

bool PathPtr::startsWith(PathPtr prefix) const {
  return parts.size() >= prefix.parts.size() &&
         parts.first(prefix.parts.size()) == prefix.parts;
}